

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O0

void __thiscall
spv::Builder::accessChainPushComponent
          (Builder *this,Id component,Id preSwizzleBaseType,CoherentFlags coherentFlags,
          uint alignment)

{
  size_type sVar1;
  uint alignment_local;
  Id preSwizzleBaseType_local;
  Id component_local;
  Builder *this_local;
  CoherentFlags coherentFlags_local;
  
  this_local._4_4_ = coherentFlags;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if ((sVar1 != 1) &&
     ((this->accessChain).component = component, (this->accessChain).preSwizzleBaseType == 0)) {
    (this->accessChain).preSwizzleBaseType = preSwizzleBaseType;
  }
  AccessChain::CoherentFlags::operator|=
            (&(this->accessChain).coherentFlags,(CoherentFlags *)((long)&this_local + 4));
  (this->accessChain).alignment = alignment | (this->accessChain).alignment;
  return;
}

Assistant:

void accessChainPushComponent(Id component, Id preSwizzleBaseType, AccessChain::CoherentFlags coherentFlags,
        unsigned int alignment)
    {
        if (accessChain.swizzle.size() != 1) {
            accessChain.component = component;
            if (accessChain.preSwizzleBaseType == NoType)
                accessChain.preSwizzleBaseType = preSwizzleBaseType;
        }
        accessChain.coherentFlags |= coherentFlags;
        accessChain.alignment |= alignment;
    }